

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execNegEa<(moira::Instr)86,(moira::Mode)8,(moira::Size)1>(Moira *this,u16 opcode)

{
  byte bVar1;
  u32 addr;
  u32 uVar2;
  u32 uVar3;
  
  addr = computeEA<(moira::Mode)8,(moira::Size)1,0ul>(this,opcode & 7);
  uVar2 = readM<(moira::MemSpace)1,(moira::Size)1,0ul>(this,addr);
  bVar1 = (byte)~uVar2;
  (this->reg).sr.n = (bool)(bVar1 >> 7);
  (this->reg).sr.z = bVar1 == 0;
  (this->reg).sr.v = false;
  (this->reg).sr.c = false;
  uVar3 = (this->reg).pc;
  (this->reg).pc0 = uVar3;
  (this->queue).ird = (this->queue).irc;
  uVar3 = readM<(moira::MemSpace)2,(moira::Size)2,0ul>(this,uVar3 + 2);
  (this->queue).irc = (u16)uVar3;
  writeM<(moira::MemSpace)1,(moira::Size)1,4ul>(this,addr,~uVar2);
  return;
}

Assistant:

void
Moira::execNegEa(u16 opcode)
{
    int dst = ( _____________xxx(opcode) );
    u32 ea, data;

    if (!readOp<M,S,STD_AE_FRAME>(dst, ea, data)) return;
    
    data = logic<I,S>(data);
    prefetch();

    writeOp<M,S,POLLIPL>(dst, ea, data);
}